

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void * lua_newuserdata(lua_State *L,size_t size)

{
  Value VVar1;
  StkId pTVar2;
  TValue *pTVar3;
  GCObject *pGVar4;
  
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  if (L->ci == L->base_ci) {
    pTVar3 = &L->l_gt;
  }
  else {
    pTVar3 = (TValue *)&(((L->ci->func->value).gc)->h).array;
  }
  VVar1 = pTVar3->value;
  pGVar4 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,size + 0x28);
  (pGVar4->gch).marked = L->l_G->currentwhite & 3;
  *(undefined1 *)((long)pGVar4 + 8) = 7;
  *(size_t *)((long)pGVar4 + 0x20) = size;
  *(undefined8 *)((long)pGVar4 + 0x10) = 0;
  *(Value *)((long)pGVar4 + 0x18) = VVar1;
  (pGVar4->gch).next = L->l_G->mainthread->next;
  L->l_G->mainthread->next = pGVar4;
  pTVar2 = L->top;
  (pTVar2->value).p = pGVar4;
  pTVar2->tt = 7;
  L->top = L->top + 1;
  return (void *)((long)pGVar4 + 0x28);
}

Assistant:

static void*lua_newuserdata(lua_State*L,size_t size){
Udata*u;
luaC_checkGC(L);
u=luaS_newudata(L,size,getcurrenv(L));
setuvalue(L,L->top,u);
api_incr_top(L);
return u+1;
}